

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QPersistentModelIndex>::erase
          (QMovableArrayOps<QPersistentModelIndex> *this,QPersistentModelIndex *b,qsizetype n)

{
  QPersistentModelIndex *__src;
  QPersistentModelIndex *pQVar1;
  long lVar2;
  QPersistentModelIndex *pQVar3;
  
  __src = b + n;
  if (n != 0) {
    lVar2 = n * 8;
    pQVar3 = b;
    do {
      QPersistentModelIndex::~QPersistentModelIndex(pQVar3);
      pQVar3 = pQVar3 + 1;
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0);
  }
  pQVar1 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
           super_QArrayDataPointer<QPersistentModelIndex>.ptr;
  lVar2 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
          super_QArrayDataPointer<QPersistentModelIndex>.size;
  pQVar3 = pQVar1 + lVar2;
  if (__src == pQVar3 || pQVar1 != b) {
    if (__src != pQVar3) {
      memmove(b,__src,(long)pQVar3 - (long)__src);
      lVar2 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
              super_QArrayDataPointer<QPersistentModelIndex>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<QPersistentModelIndex>).
    super_QArrayDataPointer<QPersistentModelIndex>.ptr = __src;
  }
  (this->super_QGenericArrayOps<QPersistentModelIndex>).
  super_QArrayDataPointer<QPersistentModelIndex>.size = lVar2 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }